

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CallInstr *callInstr)

{
  LiteralType LVar1;
  pointer ppVVar2;
  Signature *pSVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = (int)((ulong)((long)(callInstr->super_Instr).operands_.
                              super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(callInstr->super_Instr).operands_.
                             super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar7) {
    uVar6 = (ulong)uVar7;
  }
  for (; ppVVar2 = (callInstr->super_Instr).operands_.
                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                   super__Vector_impl_data._M_start, uVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
    emitLoad(this,*(Value **)((long)ppVVar2 + lVar5 + 8));
  }
  pSVar3 = IRBuiltinFunction::signature((IRBuiltinFunction *)*ppVVar2);
  LVar1 = pSVar3->returnType_;
  sVar4 = ConstantPool::makeNativeFunction
                    (&this->cp_,
                     (IRBuiltinFunction *)
                     *(callInstr->super_Instr).operands_.
                      super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  emitInstr(this,CALL,(Operand)sVar4,
            (short)((uint)(*(int *)&(callInstr->super_Instr).operands_.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(callInstr->super_Instr).operands_.
                                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1,
            (ushort)(LVar1 != Void));
  if (uVar7 != 0) {
    pop(this,(long)(int)uVar7);
  }
  if (LVar1 != Void) {
    push(this,(Value *)callInstr);
    if ((callInstr->super_Instr).super_Value.uses_.
        super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (callInstr->super_Instr).super_Value.uses_.
        super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      emitInstr(this,0x10002);
      pop(this,1);
      return;
    }
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CallInstr& callInstr) {
  const int argc = callInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(callInstr.operand(i));

  const bool returnsValue =
      callInstr.callee()->signature().returnType() != LiteralType::Void;

  emitInstr(Opcode::CALL,
      cp_.makeNativeFunction(callInstr.callee()),
      callInstr.operands().size() - 1,
      returnsValue ? 1 : 0);

  if (argc)
    pop(argc);

  if (returnsValue) {
    push(&callInstr);

    if (!callInstr.isUsed()) {
      emitInstr(Opcode::DISCARD, 1);
      pop(1);
    }
  }
}